

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_VerifyBeforeCertRequest_Test::TestBody
          (SSLVersionTest_VerifyBeforeCertRequest_Test *this)

{
  bool bVar1;
  pointer psVar2;
  _func_ssl_verify_result_t_SSL_ptr_uint8_t_ptr *p_Var3;
  _func_int_SSL_ptr_void_ptr *cb;
  pointer server_ctx;
  char *pcVar4;
  UniquePtr<SSL_CTX> *this_00;
  UniquePtr<SSL_CTX> *this_01;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0 [3];
  ClientConfig local_98;
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  SSLVersionTest_VerifyBeforeCertRequest_Test *this_local;
  
  this_00 = &(this->super_SSLVersionTest).server_ctx_;
  psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(this_00);
  p_Var3 = (anonymous_namespace)::SSLVersionTest_VerifyBeforeCertRequest_Test::TestBody()::$_0::
           operator_cast_to_function_pointer
                     ((__0 *)((long)&client._M_t.
                                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + 7));
  SSL_CTX_set_custom_verify(psVar2,1,p_Var3);
  this_01 = &(this->super_SSLVersionTest).client_ctx_;
  psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(this_01);
  p_Var3 = (anonymous_namespace)::SSLVersionTest_VerifyBeforeCertRequest_Test::TestBody()::$_1::
           operator_cast_to_function_pointer
                     ((__1 *)((long)&client._M_t.
                                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + 6));
  SSL_CTX_set_custom_verify(psVar2,1,p_Var3);
  psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(this_01);
  cb = (anonymous_namespace)::SSLVersionTest_VerifyBeforeCertRequest_Test::TestBody()::$_2::
       operator_cast_to_function_pointer
                 ((__2 *)((long)&client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + 5));
  SSL_CTX_set_cert_cb(psVar2,cb,(void *)0x0);
  std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&server);
  std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&gtest_ar_.message_);
  psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(this_01);
  server_ctx = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(this_00);
  local_98.verify_hostname.field_2._M_allocated_capacity = 0;
  local_98.verify_hostname.field_2._8_8_ = 0;
  local_98.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
  local_98.verify_hostname._1_7_ = 0;
  local_98.verify_hostname._M_string_length = 0;
  local_98.servername.field_2._M_allocated_capacity = 0;
  local_98.servername.field_2._8_8_ = 0;
  local_98.servername._M_dataplus = (_Alloc_hider)0x0;
  local_98.servername._1_7_ = 0;
  local_98.servername._M_string_length = 0;
  local_98.session = (SSL_SESSION *)0x0;
  local_98.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
  local_98.hostflags = 0;
  local_98.early_data = false;
  local_98._85_3_ = 0;
  ClientConfig::ClientConfig(&local_98);
  pcVar4 = (char *)0x1;
  bVar1 = ConnectClientAndServer
                    (&server,(UniquePtr<SSL> *)&gtest_ar_.message_,psVar2,server_ctx,&local_98,true)
  ;
  local_39 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_38,&local_39,(type *)0x0)
  ;
  ClientConfig::~ClientConfig(&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_38,
               (AssertionResult *)
               "ConnectClientAndServer(&client, &server, client_ctx_.get(), server_ctx_.get())",
               "true","false",pcVar4);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x197f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b8,local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
  return;
}

Assistant:

TEST_P(SSLVersionTest, VerifyBeforeCertRequest) {
  // Configure the server to request client certificates.
  SSL_CTX_set_custom_verify(
      server_ctx_.get(), SSL_VERIFY_PEER,
      [](SSL *ssl, uint8_t *out_alert) { return ssl_verify_ok; });

  // Configure the client to reject the server certificate.
  SSL_CTX_set_custom_verify(
      client_ctx_.get(), SSL_VERIFY_PEER,
      [](SSL *ssl, uint8_t *out_alert) { return ssl_verify_invalid; });

  // cert_cb should not be called. Verification should fail first.
  SSL_CTX_set_cert_cb(
      client_ctx_.get(),
      [](SSL *ssl, void *arg) {
        ADD_FAILURE() << "cert_cb unexpectedly called";
        return 0;
      },
      nullptr);

  bssl::UniquePtr<SSL> client, server;
  EXPECT_FALSE(ConnectClientAndServer(&client, &server, client_ctx_.get(),
                                      server_ctx_.get()));
}